

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzmatrix.cpp
# Opt level: O0

int __thiscall
TPZMatrix<Fad<double>_>::Subst_Backward(TPZMatrix<Fad<double>_> *this,TPZFMatrix<Fad<double>_> *B)

{
  double *pdVar1;
  TPZBaseMatrix *pTVar2;
  Fad<double> *w;
  Fad<double> *pFVar3;
  int64_t iVar4;
  TPZBaseMatrix *in_RSI;
  FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_> *in_RDI;
  int64_t i;
  Fad<double> sum;
  int64_t c;
  Fad<double> pivot;
  int64_t r;
  Fad<double> *in_stack_fffffffffffffe90;
  double *in_stack_fffffffffffffe98;
  Fad<double> *in_stack_fffffffffffffea0;
  Fad<double> *in_stack_fffffffffffffec8;
  FadExpr<FadBinaryDiv<FadExpr<FadBinaryMinus<Fad<double>,_Fad<double>_>_>,_Fad<double>_>_>
  *in_stack_fffffffffffffed8;
  Fad<double> *in_stack_fffffffffffffee0;
  undefined1 local_f8 [32];
  undefined1 local_d8 [32];
  undefined1 local_b8 [48];
  Fad<double> *local_88;
  undefined8 local_80;
  double *local_48;
  undefined1 local_40 [32];
  Fad<double> *local_20;
  TPZBaseMatrix *local_18;
  int local_4;
  
  local_18 = in_RSI;
  w = (Fad<double> *)TPZBaseMatrix::Rows(in_RSI);
  pFVar3 = (Fad<double> *)(*(code *)(in_RDI->fadexpr_).left_[3].val_)();
  if (((w == pFVar3) && (*(char *)&in_RDI[1].fadexpr_.right_ != '\0')) &&
     (*(char *)&in_RDI[1].fadexpr_.right_ == '\x03')) {
    local_20 = (Fad<double> *)(*(code *)(in_RDI->fadexpr_).left_[3].val_)();
    while (local_20 = (Fad<double> *)((long)&local_20[-1].defaultVal + 7), -1 < (long)local_20) {
      (*(code *)(in_RDI->fadexpr_).left_[9].val_)(local_40,in_RDI,local_20,local_20);
      local_48 = (double *)0x0;
      while( true ) {
        pdVar1 = local_48;
        iVar4 = TPZBaseMatrix::Cols(local_18);
        if (iVar4 <= (long)pdVar1) break;
        local_80 = 0;
        Fad<double>::Fad<double,_nullptr>(in_stack_fffffffffffffea0,in_stack_fffffffffffffe98);
        in_stack_fffffffffffffea0 = (Fad<double> *)(*(code *)(in_RDI->fadexpr_).left_[3].val_)();
        local_88 = in_stack_fffffffffffffea0;
        while (pTVar2 = local_18, local_88 = (Fad<double> *)((long)&local_88[-1].defaultVal + 7),
              (long)local_20 < (long)local_88) {
          (*(code *)(in_RDI->fadexpr_).left_[9].val_)(local_b8,in_RDI,local_20,local_88);
          (*(local_18->super_TPZSavable)._vptr_TPZSavable[0x24])
                    (local_d8,local_18,local_88,local_48);
          operator*<Fad<double>,_Fad<double>,_nullptr>(in_stack_fffffffffffffec8,w);
          Fad<double>::operator+=(w,in_RDI);
          FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>::~FadExpr
                    ((FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_> *)in_stack_fffffffffffffe90)
          ;
          Fad<double>::~Fad(in_stack_fffffffffffffe90);
          Fad<double>::~Fad(in_stack_fffffffffffffe90);
        }
        in_stack_fffffffffffffe90 = local_20;
        in_stack_fffffffffffffe98 = local_48;
        (*(local_18->super_TPZSavable)._vptr_TPZSavable[0x24])(&stack0xfffffffffffffec8);
        operator-<Fad<double>,_Fad<double>,_nullptr>(in_stack_fffffffffffffec8,w);
        operator/<FadExpr<FadBinaryMinus<Fad<double>,_Fad<double>_>_>,_Fad<double>,_nullptr>
                  ((FadExpr<FadBinaryMinus<Fad<double>,_Fad<double>_>_> *)in_stack_fffffffffffffec8,
                   w);
        Fad<double>::Fad<FadBinaryDiv<FadExpr<FadBinaryMinus<Fad<double>,Fad<double>>>,Fad<double>>>
                  (in_stack_fffffffffffffee0,in_stack_fffffffffffffed8);
        (*(pTVar2->super_TPZSavable)._vptr_TPZSavable[0x23])
                  (pTVar2,in_stack_fffffffffffffe90,in_stack_fffffffffffffe98,local_f8);
        Fad<double>::~Fad(in_stack_fffffffffffffe90);
        FadExpr<FadBinaryDiv<FadExpr<FadBinaryMinus<Fad<double>,_Fad<double>_>_>,_Fad<double>_>_>::
        ~FadExpr((FadExpr<FadBinaryDiv<FadExpr<FadBinaryMinus<Fad<double>,_Fad<double>_>_>,_Fad<double>_>_>
                  *)in_stack_fffffffffffffe90);
        FadExpr<FadBinaryMinus<Fad<double>,_Fad<double>_>_>::~FadExpr
                  ((FadExpr<FadBinaryMinus<Fad<double>,_Fad<double>_>_> *)in_stack_fffffffffffffe90)
        ;
        Fad<double>::~Fad(in_stack_fffffffffffffe90);
        Fad<double>::~Fad(in_stack_fffffffffffffe90);
        local_48 = (double *)((long)local_48 + 1);
      }
      Fad<double>::~Fad(in_stack_fffffffffffffe90);
    }
    local_4 = 1;
  }
  else {
    local_4 = 0;
  }
  return local_4;
}

Assistant:

int TPZMatrix<TVar>::Subst_Backward( TPZFMatrix<TVar> *B ) const {
	
	if ( (B->Rows() != Dim()) || !fDecomposed || fDecomposed != ECholesky) return( 0 );
	for ( int64_t r = Dim()-1;  r >= 0;  r-- ) {
		TVar pivot = GetVal( r, r );
		for ( int64_t c = 0; c < B->Cols(); c++ ) {
			// Faz sum = SOMA( A[r,i] * B[i,c] ); i = N, ..., r+1.
			//
			TVar sum = 0.0;
			for ( int64_t i = Dim()-1; i > r; i-- ) sum += GetVal(r, i) * B->GetVal(i, c);
            // Faz B[r,c] = (B[r,c] - sum) / A[r,r].
            //
            B->PutVal( r, c, (B->GetVal(r, c) - sum) / pivot );
        }
    }
    return( 1 );
}